

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O1

void P_CalcHeight(player_t *player)

{
  float fVar1;
  APlayerPawn *pAVar2;
  bool bVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  if (((uint)player->cheats >> 0x1e & 1) == 0) {
    if ((((player->mo->super_AActor).flags.Value & 0x200) != 0) && (player->onground == false)) {
      dVar6 = 0.5;
LAB_005597ab:
      player->bob = dVar6;
      goto LAB_005597af;
    }
    dVar6 = (player->Vel).X;
    dVar7 = (player->Vel).Y;
    dVar6 = dVar7 * dVar7 + dVar6 * dVar6;
    player->bob = dVar6;
    bVar3 = true;
    if ((dVar6 != 0.0) || (NAN(dVar6))) {
      puVar4 = (undefined8 *)
               ((long)&((player->userinfo).
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                       .Nodes)->Next +
               (ulong)(((player->userinfo).
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                        .Size - 1 & 0x21b) * 0x18));
      do {
        puVar5 = puVar4;
        puVar4 = (undefined8 *)*puVar5;
      } while (*(int *)(puVar5 + 1) != 0x21b);
      dVar6 = dVar6 * (double)*(float *)(puVar5[2] + 0x28);
      player->bob = dVar6;
      if (dVar6 <= 16.0) goto LAB_005597af;
      dVar6 = 16.0;
      goto LAB_005597ab;
    }
  }
  else {
    player->bob = 0.0;
LAB_005597af:
    bVar3 = false;
  }
  pAVar2 = player->mo;
  dVar6 = pAVar2->ViewHeight + player->crouchviewdelta;
  if ((player->cheats & 4U) != 0) {
    dVar6 = dVar6 + (pAVar2->super_AActor).__Pos.Z;
    player->viewz = dVar6;
    dVar7 = (pAVar2->super_AActor).ceilingz + -4.0;
    if (dVar6 <= dVar7) {
      return;
    }
    goto LAB_005599a7;
  }
  if (bVar3) {
    if (player->health < 1) {
      dVar7 = 0.0;
    }
    else {
      puVar4 = (undefined8 *)
               ((long)&((player->userinfo).
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                       .Nodes)->Next +
               (ulong)(((player->userinfo).
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                        .Size - 1 & 0x21c) * 0x18));
      do {
        puVar5 = puVar4;
        puVar4 = (undefined8 *)*puVar5;
      } while (*(int *)(puVar5 + 1) != 0x21c);
      fVar1 = *(float *)(puVar5[2] + 0x28);
      dVar7 = FFastTrig::sin(&fasttrig,
                             ((double)level.time / 120.0) * 360.0 * 11930464.711111112 +
                             6755399441055744.0);
      dVar7 = dVar7 * (double)fVar1;
    }
  }
  else {
    dVar7 = player->bob;
    dVar8 = FFastTrig::sin(&fasttrig,
                           ((double)level.time / 20.0) * 360.0 * 11930464.711111112 +
                           6755399441055744.0);
    dVar7 = dVar8 * dVar7 *
            *(double *)(&DAT_00743d30 + (ulong)(1 < (player->mo->super_AActor).waterlevel) * 8);
  }
  if (player->playerstate == '\0') {
    dVar8 = player->viewheight + player->deltaviewheight;
    player->viewheight = dVar8;
    if (dVar8 <= dVar6) {
      if ((dVar8 < dVar6 * 0.5) &&
         (player->viewheight = dVar6 * 0.5, player->deltaviewheight <= 0.0)) {
        dVar6 = 1.52587890625e-05;
        goto LAB_005599d4;
      }
    }
    else {
      player->viewheight = dVar6;
      dVar6 = 0.0;
LAB_005599d4:
      player->deltaviewheight = dVar6;
    }
    dVar6 = player->deltaviewheight;
    if ((dVar6 != 0.0) || (NAN(dVar6))) {
      dVar6 = dVar6 + 0.25;
      player->deltaviewheight = dVar6;
      if ((dVar6 == 0.0) && (!NAN(dVar6))) {
        player->deltaviewheight = 1.52587890625e-05;
      }
    }
  }
  if (player->morphTics != 0) {
    dVar7 = 0.0;
  }
  pAVar2 = player->mo;
  dVar6 = (pAVar2->super_AActor).__Pos.Z;
  dVar7 = player->viewheight + dVar6 + dVar7;
  player->viewz = dVar7;
  if (player->playerstate != '\x01') {
    dVar8 = (pAVar2->super_AActor).Floorclip;
    if (((dVar8 != 0.0) || (NAN(dVar8))) && (dVar6 <= (pAVar2->super_AActor).floorz)) {
      player->viewz = dVar7 - dVar8;
    }
  }
  dVar6 = (pAVar2->super_AActor).ceilingz + -4.0;
  if (dVar6 < player->viewz) {
    player->viewz = dVar6;
  }
  dVar7 = (pAVar2->super_AActor).floorz + 4.0;
  if (dVar7 < player->viewz || dVar7 == player->viewz) {
    return;
  }
LAB_005599a7:
  player->viewz = dVar7;
  return;
}

Assistant:

void P_CalcHeight (player_t *player) 
{
	DAngle		angle;
	double	 	bob;
	bool		still = false;

	// Regular movement bobbing
	// (needs to be calculated for gun swing even if not on ground)

	// killough 10/98: Make bobbing depend only on player-applied motion.
	//
	// Note: don't reduce bobbing here if on ice: if you reduce bobbing here,
	// it causes bobbing jerkiness when the player moves from ice to non-ice,
	// and vice-versa.

	if (player->cheats & CF_NOCLIP2)
	{
		player->bob = 0;
	}
	else if ((player->mo->flags & MF_NOGRAVITY) && !player->onground)
	{
		player->bob = 0.5;
	}
	else
	{
		player->bob = player->Vel.LengthSquared();
		if (player->bob == 0)
		{
			still = true;
		}
		else
		{
			player->bob *= player->userinfo.GetMoveBob();

			if (player->bob > MAXBOB)
				player->bob = MAXBOB;
		}
	}

	double defaultviewheight = player->mo->ViewHeight + player->crouchviewdelta;

	if (player->cheats & CF_NOVELOCITY)
	{
		player->viewz = player->mo->Z() + defaultviewheight;

		if (player->viewz > player->mo->ceilingz-4)
			player->viewz = player->mo->ceilingz-4;

		return;
	}

	if (still)
	{
		if (player->health > 0)
		{
			angle = level.time / (120 * TICRATE / 35.) * 360.;
			bob = player->userinfo.GetStillBob() * angle.Sin();
		}
		else
		{
			bob = 0;
		}
	}
	else
	{
		angle = level.time / (20 * TICRATE / 35.) * 360.;
		bob = player->bob * angle.Sin() * (player->mo->waterlevel > 1 ? 0.25f : 0.5f);
	}

	// move viewheight
	if (player->playerstate == PST_LIVE)
	{
		player->viewheight += player->deltaviewheight;

		if (player->viewheight > defaultviewheight)
		{
			player->viewheight = defaultviewheight;
			player->deltaviewheight = 0;
		}
		else if (player->viewheight < (defaultviewheight/2))
		{
			player->viewheight = defaultviewheight/2;
			if (player->deltaviewheight <= 0)
				player->deltaviewheight = 1 / 65536.;
		}
		
		if (player->deltaviewheight)	
		{
			player->deltaviewheight += 0.25;
			if (!player->deltaviewheight)
				player->deltaviewheight = 1/65536.;
		}
	}

	if (player->morphTics)
	{
		bob = 0;
	}
	player->viewz = player->mo->Z() + player->viewheight + bob;
	if (player->mo->Floorclip && player->playerstate != PST_DEAD
		&& player->mo->Z() <= player->mo->floorz)
	{
		player->viewz -= player->mo->Floorclip;
	}
	if (player->viewz > player->mo->ceilingz - 4)
	{
		player->viewz = player->mo->ceilingz - 4;
	}
	if (player->viewz < player->mo->floorz + 4)
	{
		player->viewz = player->mo->floorz + 4;
	}
}